

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

void __thiscall ParameterBase::~ParameterBase(ParameterBase *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ParameterBase_0034b1b8;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

virtual ~ParameterBase() {}